

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::Symbol::GetVisibilityError_abi_cxx11_
          (string *__return_storage_ptr__,Symbol *this,FileDescriptor *other,string_view usage)

{
  bool bVar1;
  FeatureSet_VisibilityFeature_DefaultSymbolVisibility value;
  FileDescriptor *pFVar2;
  FeatureSet *this_00;
  string *str;
  AlphaNum *c;
  AlphaNum *in_R9;
  char (*in_stack_fffffffffffffc98) [45];
  string_view local_328;
  AlphaNum local_318;
  char *local_2e8;
  size_t sStack_2e0;
  AlphaNum local_2d8;
  AlphaNum local_2a8;
  size_t local_278;
  size_t sStack_270;
  AlphaNum local_260;
  AlphaNum local_230;
  AlphaNum local_200;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  byte local_15a;
  allocator<char> local_159;
  undefined1 local_158 [8];
  string reason;
  SymbolVisibility explicit_visibility;
  AlphaNum local_120;
  AlphaNum local_f0;
  size_t local_c0;
  size_t local_b8;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined1 auStack_50 [8];
  string_view symbol_name;
  string_view file_path;
  FileDescriptor *other_local;
  Symbol *this_local;
  string_view usage_local;
  
  c = (AlphaNum *)usage._M_str;
  this_local = (Symbol *)usage._M_len;
  usage_local._M_len = (size_t)c;
  usage_local._M_str = (char *)__return_storage_ptr__;
  pFVar2 = GetFile(this);
  if (pFVar2 == (FileDescriptor *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&symbol_name._M_str,
               "unknown_file");
  }
  else {
    pFVar2 = GetFile(this);
    join_0x00000010_0x00000000_ = FileDescriptor::name(pFVar2);
  }
  _auStack_50 = full_name(this);
  bVar1 = IsType(this);
  if (bVar1) {
    reason.field_2._12_4_ = visibility_keyword(this);
    local_15a = 0;
    if (reason.field_2._12_4_ == VISIBILITY_LOCAL) {
      std::allocator<char>::allocator();
      local_15a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_158,"It is explicitly marked \'local\'",&local_159);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum
                (&local_1a0,
                 "It defaulted to local from file-level \'option features.default_symbol_visibility = \'"
                );
      this_00 = features(this);
      value = FeatureSet::default_symbol_visibility(this_00);
      str = FeatureSet_VisibilityFeature_DefaultSymbolVisibility_Name<google::protobuf::FeatureSet_VisibilityFeature_DefaultSymbolVisibility>
                      (value);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1d0,str);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_200,"\';");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_158,(lts_20250127 *)&local_1a0,&local_1d0,&local_200,c);
    }
    if ((local_15a & 1) != 0) {
      std::allocator<char>::~allocator(&local_159);
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_230,"Symbol \"");
    local_278 = (size_t)auStack_50;
    sStack_270 = symbol_name._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_260,_auStack_50);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2a8,"\", defined in \"");
    local_2e8 = symbol_name._M_str;
    sStack_2e0 = file_path._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,stack0xffffffffffffffc0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_318,"\" ");
    local_328 = FileDescriptor::name(other);
    absl::lts_20250127::
    StrCat<std::basic_string_view<char,std::char_traits<char>>,char[23],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string,char[45]>
              (__return_storage_ptr__,(lts_20250127 *)&local_230,&local_260,&local_2a8,&local_2d8,
               &local_318,(AlphaNum *)&this_local,
               (basic_string_view<char,_std::char_traits<char>_> *)" is not visible from \"",
               (char (*) [23])&local_328,(basic_string_view<char,_std::char_traits<char>_> *)"\". ",
               (char (*) [4])local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " and cannot be accessed outside its own file",in_stack_fffffffffffffc98);
    std::__cxx11::string::~string((string *)local_158);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_80,"Attempt to get a visibility error for a non-message/enum symbol ");
    local_c0 = (size_t)auStack_50;
    local_b8 = symbol_name._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,_auStack_50);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,"\", defined in \"");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_120,stack0xffffffffffffffc0);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_80,&local_b0,&local_f0,&local_120,in_R9
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetVisibilityError(FileDescriptor* other,
                                 absl::string_view usage = "") const {
    const absl::string_view file_path =
        GetFile() != nullptr ? GetFile()->name() : "unknown_file";
    const absl::string_view symbol_name = full_name();

    if (!IsType()) {
      return absl::StrCat(
          "Attempt to get a visibility error for a non-message/enum symbol ",
          symbol_name, "\", defined in \"", file_path);
    }

    SymbolVisibility explicit_visibility = visibility_keyword();

    std::string reason =
        explicit_visibility == SymbolVisibility::VISIBILITY_LOCAL
            ? "It is explicitly marked 'local'"
            : absl::StrCat(
                  "It defaulted to local from file-level 'option "
                  "features.default_symbol_visibility = '",
                  FeatureSet_VisibilityFeature_DefaultSymbolVisibility_Name(
                      features().default_symbol_visibility()),
                  "';");

    return absl::StrCat("Symbol \"", symbol_name, "\", defined in \"",
                        file_path, "\" ", usage,
                        " is "
                        "not visible from \"",
                        other->name(), "\". ", reason,
                        " and cannot be accessed outside its own file");
  }